

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O1

Var __thiscall
Js::InterpreterStackFrame::ProcessThunk
          (InterpreterStackFrame *this,void *address,void *addressOfReturnAddress)

{
  Var pvVar1;
  undefined1 local_28 [8];
  PushPopFrameHelper pushPopFrameHelper;
  
  local_28 = *(undefined1 (*) [8])(*(long *)(this + 0x78) + 0x3b8);
  pushPopFrameHelper.m_interpreterFrame._0_1_ = 0;
  *(void **)(this + 0x98) = address;
  *(void **)(this + 0xa0) = addressOfReturnAddress;
  pushPopFrameHelper.m_threadContext = (ThreadContext *)this;
  if ((*(byte *)(*(long *)(this + 0x88) + 0x46) & 2) == 0) {
    ThreadContext::PushInterpreterFrame((ThreadContext *)local_28,this);
  }
  else {
    pushPopFrameHelper.m_interpreterFrame._0_1_ = 1;
  }
  pvVar1 = Process(this);
  PushPopFrameHelper::~PushPopFrameHelper((PushPopFrameHelper *)local_28);
  return pvVar1;
}

Assistant:

_NOINLINE
        Var InterpreterStackFrame::ProcessThunk(void* address, void* addressOfReturnAddress)
    {
        PushPopFrameHelper pushPopFrameHelper(this, address, addressOfReturnAddress);
        return this->Process();
    }